

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Server.h
# Opt level: O2

void __thiscall Server<Client>::start(Server<Client> *this)

{
  packaged_task<void()> *this_00;
  socklen_t *in_RCX;
  sockaddr *in_RDX;
  sockaddr *extraout_RDX;
  Client cl;
  packaged_task<void_()> task;
  undefined1 auStack_58 [40];
  
  LOCK();
  (this->is_working)._M_base._M_i = true;
  UNLOCK();
  this_00 = (packaged_task<void()> *)(auStack_58 + 0x18);
  while (((this->is_working)._M_base._M_i & 1U) != 0) {
    Acceptor<Client>::accept((Acceptor<Client> *)auStack_58,(int)this + 8,in_RDX,in_RCX);
    auStack_58._8_8_ = this;
    Client::Client((Client *)(auStack_58 + 0x10),(Client *)auStack_58);
    std::packaged_task<void()>::packaged_task<Server<Client>::start()::_lambda()_1_,void>
              (this_00,(anon_class_16_2_37edc3c6_for__M_fn *)(auStack_58 + 8));
    Client::~Client((Client *)(auStack_58 + 0x10));
    NotLockFreeQueue<std::packaged_task<void_()>_>::push_and_wait
              (&(this->thread_pool).queue,(packaged_task<void_()> *)this_00);
    std::packaged_task<void_()>::~packaged_task((packaged_task<void_()> *)this_00);
    Client::~Client((Client *)auStack_58);
    in_RDX = extraout_RDX;
  }
  return;
}

Assistant:

void Server<T>::start() {
    is_working = true;
    while(is_working) {
        T cl(acceptor.accept());
        std::packaged_task<void(void)> task(
            [this, client = std::move(cl)] () mutable {
                handler.handle(std::move(client));
            }
        );
        thread_pool.push(std::move(task));
    }
}